

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O2

UBool __thiscall
icu_63::TailoredSet::handleCE32(TailoredSet *this,UChar32 start,UChar32 end,uint32_t ce32)

{
  CollationData *this_00;
  bool bVar1;
  UBool UVar2;
  uint32_t uVar3;
  
  if ((~ce32 & 0xc0) == 0) {
    ce32 = CollationData::getIndirectCE32(this->data,ce32);
    if (ce32 == 0xc0) goto LAB_0023572f;
  }
  do {
    this_00 = this->baseData;
    uVar3 = CollationData::getCE32(this_00,start);
    uVar3 = CollationData::getFinalCE32(this_00,uVar3);
    UVar2 = Collation::isSelfContainedCE32(ce32);
    if (UVar2 == '\0') {
LAB_00235713:
      compare(this,start,ce32,uVar3);
    }
    else {
      UVar2 = Collation::isSelfContainedCE32(uVar3);
      if (UVar2 == '\0') goto LAB_00235713;
      if (ce32 != uVar3) {
        UnicodeSet::add(this->tailored,start);
      }
    }
    bVar1 = start < end;
    start = start + 1;
  } while (bVar1);
LAB_0023572f:
  return this->errorCode < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

UBool
TailoredSet::handleCE32(UChar32 start, UChar32 end, uint32_t ce32) {
    U_ASSERT(ce32 != Collation::FALLBACK_CE32);
    if(Collation::isSpecialCE32(ce32)) {
        ce32 = data->getIndirectCE32(ce32);
        if(ce32 == Collation::FALLBACK_CE32) {
            return U_SUCCESS(errorCode);
        }
    }
    do {
        uint32_t baseCE32 = baseData->getFinalCE32(baseData->getCE32(start));
        // Do not just continue if ce32 == baseCE32 because
        // contractions and expansions in different data objects
        // normally differ even if they have the same data offsets.
        if(Collation::isSelfContainedCE32(ce32) && Collation::isSelfContainedCE32(baseCE32)) {
            // fastpath
            if(ce32 != baseCE32) {
                tailored->add(start);
            }
        } else {
            compare(start, ce32, baseCE32);
        }
    } while(++start <= end);
    return U_SUCCESS(errorCode);
}